

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::C_FindObjectsInit
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount)

{
  _Rb_tree_header *p_Var1;
  SessionObjectStore *this_00;
  unsigned_long uVar2;
  char cVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  Session *this_01;
  Slot *this_02;
  CK_STATE CVar7;
  Token *this_03;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_04;
  CK_SLOT_ID CVar8;
  unsigned_long uVar9;
  ByteString *pBVar10;
  size_t sVar11;
  size_t sVar12;
  _Base_ptr p_Var13;
  size_t *outlen;
  CK_ULONG CVar14;
  char *in_R8;
  size_t *psVar15;
  size_t in_R9;
  CK_RV CVar16;
  unsigned_long *puVar17;
  bool bVar18;
  ByteString bsAttrValue;
  set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> allObjects;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> handles;
  ByteString bsTemplateValue;
  OSAttribute attr;
  ByteString local_180;
  _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
  local_158;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_128;
  ByteString local_f8;
  OSAttribute local_d0;
  
  CVar16 = 400;
  if ((this->isInitialised == true) &&
     (CVar16 = 7, pTemplate != (CK_ATTRIBUTE_PTR)0x0 || ulCount == 0)) {
    this_01 = (Session *)HandleManager::getSession(this->handleManager,hSession);
    if (this_01 == (Session *)0x0) {
      CVar16 = 0xb3;
    }
    else {
      this_02 = Session::getSlot(this_01);
      CVar16 = 5;
      if (this_02 != (Slot *)0x0) {
        CVar7 = Session::getState(this_01);
        this_03 = Session::getToken(this_01);
        if (this_03 != (Token *)0x0) {
          iVar6 = Session::getOpType(this_01);
          CVar16 = 0x90;
          if (iVar6 == 0) {
            Session::setOpType(this_01,1);
            this_04 = (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)FindOperation::create();
            if (this_04 ==
                (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)0x0) {
              CVar16 = 2;
            }
            else {
              p_Var1 = &local_158._M_impl.super__Rb_tree_header;
              local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_158._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
              local_158._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
              Token::getObjects(this_03,(set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
                                         *)&local_158);
              this_00 = this->sessionObjectStore;
              CVar8 = Slot::getSlotID(this_02);
              SessionObjectStore::getObjects
                        (this_00,CVar8,
                         (set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
                         &local_158);
              local_128._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_128._M_impl.super__Rb_tree_header._M_header;
              local_128._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              outlen = (size_t *)0x0;
              local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_128._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_128._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_128._M_impl.super__Rb_tree_header._M_header._M_left;
              if ((_Rb_tree_header *)local_158._M_impl.super__Rb_tree_header._M_header._M_left !=
                  p_Var1) {
                p_Var13 = local_158._M_impl.super__Rb_tree_header._M_header._M_left;
                do {
                  cVar3 = (**(code **)(**(long **)(p_Var13 + 1) + 0x50))();
                  if (cVar3 == '\0') {
                    outlen = (size_t *)0x7bf;
                    in_R8 = "Object is not valid, skipping";
                    softHSMLog(7,"C_FindObjectsInit",
                               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                               ,0x7bf,"Object is not valid, skipping");
                  }
                  else {
                    bVar4 = (**(code **)(**(long **)(p_Var13 + 1) + 0x20))
                                      (*(long **)(p_Var13 + 1),2,1);
                    bVar18 = (CVar7 - 1 & 0xfffffffffffffffd) != 0;
                    outlen = (size_t *)CONCAT71((int7)((ulong)outlen >> 8),bVar18);
                    iVar6 = 5;
                    if ((bVar18 & bVar4) == 0) {
                      CVar14 = ulCount;
                      puVar17 = &pTemplate->ulValueLen;
                      if (ulCount == 0) {
                        bVar18 = true;
                        iVar6 = 6;
                      }
                      else {
                        do {
                          cVar3 = (**(code **)(**(long **)(p_Var13 + 1) + 0x10))
                                            (*(long **)(p_Var13 + 1),
                                             ((_CK_ATTRIBUTE *)(puVar17 + -2))->type);
                          if (cVar3 == '\0') {
                            bVar18 = false;
                            iVar6 = 6;
                            break;
                          }
                          (**(code **)(**(long **)(p_Var13 + 1) + 0x18))
                                    (&local_d0,*(long **)(p_Var13 + 1),
                                     ((_CK_ATTRIBUTE *)(puVar17 + -2))->type);
                          bVar18 = OSAttribute::isBooleanAttribute(&local_d0);
                          if (bVar18) {
                            if (*puVar17 != 1) goto LAB_0012f637;
                            cVar3 = *(char *)puVar17[-1];
                            bVar5 = OSAttribute::getBooleanValue(&local_d0);
                            outlen = (size_t *)CONCAT71((int7)((ulong)outlen >> 8),cVar3 != '\x01');
                            bVar18 = false;
                            iVar6 = 6;
                            if (bVar5 != (cVar3 != '\x01')) {
LAB_0012f6e9:
                              iVar6 = 0;
                              bVar18 = true;
                            }
                          }
                          else {
                            bVar18 = OSAttribute::isUnsignedLongAttribute(&local_d0);
                            if (bVar18) {
                              if (*puVar17 == 8) {
                                uVar2 = *(unsigned_long *)puVar17[-1];
                                uVar9 = OSAttribute::getUnsignedLongValue(&local_d0);
                                bVar18 = false;
                                iVar6 = 6;
                                if (uVar9 == uVar2) goto LAB_0012f6e9;
                                goto LAB_0012f6ef;
                              }
LAB_0012f637:
                              iVar6 = 6;
                            }
                            else {
                              bVar18 = OSAttribute::isByteStringAttribute(&local_d0);
                              if (!bVar18) goto LAB_0012f637;
                              ByteString::ByteString(&local_180);
                              if (bVar4 == 0) {
LAB_0012f645:
                                pBVar10 = OSAttribute::getByteStringValue(&local_d0);
                                ByteString::operator=(&local_180,pBVar10);
LAB_0012f65a:
                                sVar12 = ByteString::size(&local_180);
                                sVar11 = *puVar17;
                                iVar6 = 6;
                                if (sVar12 == sVar11) {
                                  if (sVar11 != 0) {
                                    ByteString::ByteString(&local_f8,(uchar *)puVar17[-1],sVar11);
                                    bVar18 = ByteString::operator!=(&local_180,&local_f8);
                                    local_f8._vptr_ByteString =
                                         (_func_int **)&PTR__ByteString_0019f880;
                                    std::
                                    _Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                                    ~_Vector_base(&local_f8.byteString.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                                 );
                                    if (bVar18) {
                                      iVar6 = 6;
                                      goto LAB_0012f6cc;
                                    }
                                  }
                                  iVar6 = 0;
                                }
                              }
                              else {
                                pBVar10 = OSAttribute::getByteStringValue(&local_d0);
                                sVar11 = ByteString::size(pBVar10);
                                if (sVar11 == 0) goto LAB_0012f645;
                                pBVar10 = OSAttribute::getByteStringValue(&local_d0);
                                iVar6 = Token::decrypt(this_03,(EVP_PKEY_CTX *)pBVar10,
                                                       (uchar *)&local_180,outlen,(uchar *)in_R8,
                                                       in_R9);
                                if ((char)iVar6 != '\0') goto LAB_0012f65a;
                                std::
                                _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                ::~_Rb_tree(this_04);
                                operator_delete(this_04);
                                iVar6 = 1;
                              }
LAB_0012f6cc:
                              local_180._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                              std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                              ~_Vector_base(&local_180.byteString.
                                             super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                           );
                              if (iVar6 == 0) goto LAB_0012f6e9;
                            }
                            bVar18 = false;
                          }
LAB_0012f6ef:
                          OSAttribute::~OSAttribute(&local_d0);
                          if (iVar6 != 0) break;
                          puVar17 = puVar17 + 3;
                          CVar14 = CVar14 - 1;
                          iVar6 = 6;
                        } while (CVar14 != 0);
                      }
                      if (iVar6 == 6) {
                        if (bVar18) {
                          CVar8 = Slot::getSlotID(this_02);
                          cVar3 = (**(code **)(**(long **)(p_Var13 + 1) + 0x20))
                                            (*(long **)(p_Var13 + 1),1,0);
                          bVar18 = (bool)(**(code **)(**(long **)(p_Var13 + 1) + 0x20))
                                                   (*(long **)(p_Var13 + 1),2,1);
                          in_R8 = *(char **)(p_Var13 + 1);
                          if (cVar3 == '\0') {
                            outlen = (size_t *)0x0;
                            local_d0._vptr_OSAttribute =
                                 (_func_int **)
                                 HandleManager::addSessionObject
                                           (this->handleManager,CVar8,hSession,bVar18,in_R8);
                          }
                          else {
                            psVar15 = (size_t *)in_R8;
                            local_d0._vptr_OSAttribute =
                                 (_func_int **)
                                 HandleManager::addTokenObject
                                           (this->handleManager,CVar8,bVar18,in_R8);
                            outlen = (size_t *)in_R8;
                            in_R8 = (char *)psVar15;
                          }
                          if (local_d0._vptr_OSAttribute == (_func_int **)0x0) {
                            std::
                            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            ::~_Rb_tree(this_04);
                            operator_delete(this_04);
                            iVar6 = 1;
                            goto LAB_0012f81b;
                          }
                          std::
                          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                          ::_M_insert_unique<unsigned_long_const&>
                                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                                      *)&local_128,(unsigned_long *)&local_d0);
                        }
                        iVar6 = 0;
                      }
                    }
LAB_0012f81b:
                    if ((iVar6 != 5) && (iVar6 != 0)) {
                      CVar16 = 5;
                      goto LAB_0012f88e;
                    }
                  }
                  p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
                } while ((_Rb_tree_header *)p_Var13 != &local_158._M_impl.super__Rb_tree_header);
              }
              FindOperation::setHandles
                        ((FindOperation *)this_04,
                         (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)&local_128);
              Session::setFindOp(this_01,(FindOperation *)this_04);
              CVar16 = 0;
LAB_0012f88e:
              std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::~_Rb_tree(&local_128);
              std::
              _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
              ::~_Rb_tree(&local_158);
            }
          }
        }
      }
    }
  }
  return CVar16;
}

Assistant:

CK_RV SoftHSM::C_FindObjectsInit(CK_SESSION_HANDLE hSession, CK_ATTRIBUTE_PTR pTemplate, CK_ULONG ulCount)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;
	if (pTemplate == NULL_PTR && ulCount != 0) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the slot
	Slot* slot = session->getSlot();
	if (slot == NULL_PTR) return CKR_GENERAL_ERROR;

	// Determine whether we have a public session or not.
	bool isPublicSession;
	switch (session->getState()) {
		case CKS_RO_USER_FUNCTIONS:
		case CKS_RW_USER_FUNCTIONS:
			isPublicSession = false;
			break;
		default:
			isPublicSession = true;
	}

	// Get the token
	Token* token = session->getToken();
	if (token == NULL_PTR) return CKR_GENERAL_ERROR;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	session->setOpType(SESSION_OP_FIND);
	FindOperation *findOp = FindOperation::create();

	// Check if we are out of memory
	if (findOp == NULL_PTR) return CKR_HOST_MEMORY;

	std::set<OSObject*> allObjects;
	token->getObjects(allObjects);
	sessionObjectStore->getObjects(slot->getSlotID(),allObjects);

	std::set<CK_OBJECT_HANDLE> handles;
	std::set<OSObject*>::iterator it;
	for (it=allObjects.begin(); it != allObjects.end(); ++it)
	{
		// Refresh object and check if it is valid
		if (!(*it)->isValid()) {
			DEBUG_MSG("Object is not valid, skipping");
			continue;
		}

		// Determine if the object has CKA_PRIVATE set to CK_TRUE
		bool isPrivateObject = (*it)->getBooleanValue(CKA_PRIVATE, true);

		// If the object is private, and we are in a public session then skip it !
		if (isPublicSession && isPrivateObject)
			continue; // skip object

		// Perform the actual attribute matching.
		bool bAttrMatch = true; // We let an empty template match everything.
		for (CK_ULONG i=0; i<ulCount; ++i)
		{
			bAttrMatch = false;

			if (!(*it)->attributeExists(pTemplate[i].type))
				break;

			OSAttribute attr = (*it)->getAttribute(pTemplate[i].type);

			if (attr.isBooleanAttribute())
			{
				if (sizeof(CK_BBOOL) != pTemplate[i].ulValueLen)
					break;
				bool bTemplateValue = (*(CK_BBOOL*)pTemplate[i].pValue == CK_TRUE);
				if (attr.getBooleanValue() != bTemplateValue)
					break;
			}
			else
			{
				if (attr.isUnsignedLongAttribute())
				{
					if (sizeof(CK_ULONG) != pTemplate[i].ulValueLen)
						break;
					CK_ULONG ulTemplateValue = *(CK_ULONG_PTR)pTemplate[i].pValue;
					if (attr.getUnsignedLongValue() != ulTemplateValue)
						break;
				}
				else
				{
					if (attr.isByteStringAttribute())
					{
						ByteString bsAttrValue;
						if (isPrivateObject && attr.getByteStringValue().size() != 0)
						{
							if (!token->decrypt(attr.getByteStringValue(), bsAttrValue))
							{
								delete findOp;
								return CKR_GENERAL_ERROR;
							}
						}
						else
							bsAttrValue = attr.getByteStringValue();

						if (bsAttrValue.size() != pTemplate[i].ulValueLen)
							break;
						if (pTemplate[i].ulValueLen != 0)
						{
							ByteString bsTemplateValue((const unsigned char*)pTemplate[i].pValue, pTemplate[i].ulValueLen);
							if (bsAttrValue != bsTemplateValue)
								break;
						}
					}
					else
						break;
				}
			}
			// The attribute matched !
			bAttrMatch = true;
		}

		if (bAttrMatch)
		{
			CK_SLOT_ID slotID = slot->getSlotID();
			bool isOnToken = (*it)->getBooleanValue(CKA_TOKEN, false);
			bool isPrivate = (*it)->getBooleanValue(CKA_PRIVATE, true);
			// Create an object handle for every returned object.
			CK_OBJECT_HANDLE hObject;
			if (isOnToken)
				hObject = handleManager->addTokenObject(slotID,isPrivate,*it);
			else
				hObject = handleManager->addSessionObject(slotID,hSession,isPrivate,*it);
			if (hObject == CK_INVALID_HANDLE)
			{
				delete findOp;
				return CKR_GENERAL_ERROR;
			}
			handles.insert(hObject);
		}
	}

	// Storing the object handles for the find will protect the library
	// whenever a stale object handle is used to access the library.
	findOp->setHandles(handles);

	session->setFindOp(findOp);

	return CKR_OK;
}